

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

Options * __thiscall restincurl::Options::Set<long>(Options *this,CURLoption *opt,long *value)

{
  CURLcode err;
  CurlException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  err = curl_easy_setopt(this->eh_->handle_,*opt,*value);
  if (err == CURLE_OK) {
    return this;
  }
  this_00 = (CurlException *)__cxa_allocate_exception(0x18);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Setting option ","");
  std::__cxx11::to_string(&local_68,*opt);
  std::operator+(&local_48,&local_88,&local_68);
  CurlException::CurlException(this_00,&local_48,err);
  __cxa_throw(this_00,&CurlException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Options& Set(const CURLoption& opt, const T& value) {
            const auto ret = curl_easy_setopt(eh_, opt, value);
            if (ret) {
                throw CurlException(
                    std::string("Setting option ") + std::to_string(opt), ret);
            }
            return *this;
        }